

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

_Bool duckdb_je_arena_boot(sc_data_t *sc_data,base_t *base,_Bool hpa)

{
  ssize_t sVar1;
  ssize_t sVar2;
  _Bool _Var3;
  ulong uVar4;
  uint32_t *puVar5;
  uint32_t uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  div_info_t *div_info;
  
  sVar1 = duckdb_je_opt_dirty_decay_ms;
  _Var3 = duckdb_je_decay_ms_valid(duckdb_je_opt_dirty_decay_ms);
  sVar2 = duckdb_je_opt_muzzy_decay_ms;
  if (_Var3) {
    dirty_decay_ms_default.repr = sVar1;
  }
  _Var3 = duckdb_je_decay_ms_valid(duckdb_je_opt_muzzy_decay_ms);
  if (_Var3) {
    muzzy_decay_ms_default.repr = sVar2;
  }
  div_info = duckdb_je_arena_binind_div_info;
  lVar9 = 0;
  do {
    duckdb_je_div_init(div_info,(ulong)(uint)(((&sc_data->sc[0].ndelta)[lVar9] <<
                                              ((byte)(&sc_data->sc[0].lg_delta)[lVar9] & 0x1f)) +
                                             (1 << ((byte)(&sc_data->sc[0].lg_base)[lVar9] & 0x1f)))
                      );
    div_info = div_info + 1;
    lVar9 = lVar9 + 7;
  } while (lVar9 != 0xfc);
  uVar4 = (ulong)duckdb_je_bin_info_nbatched_sizes;
  puVar5 = &duckdb_je_bin_infos[0].n_shards;
  uVar6 = 0x134c0;
  uVar7 = 0;
  do {
    duckdb_je_arena_bin_offsets[uVar7] = uVar6;
    iVar8 = 0x100;
    if (uVar7 < uVar4) {
      iVar8 = 0x288;
    }
    uVar6 = uVar6 + iVar8 * *puVar5;
    uVar7 = uVar7 + 1;
    puVar5 = puVar5 + 10;
  } while (uVar7 != 0x24);
  _Var3 = duckdb_je_pa_central_init
                    (&duckdb_je_arena_pa_central_global,base,hpa,&duckdb_je_hpa_hooks_default);
  return _Var3;
}

Assistant:

bool
arena_boot(sc_data_t *sc_data, base_t *base, bool hpa) {
	arena_dirty_decay_ms_default_set(opt_dirty_decay_ms);
	arena_muzzy_decay_ms_default_set(opt_muzzy_decay_ms);
	for (unsigned i = 0; i < SC_NBINS; i++) {
		sc_t *sc = &sc_data->sc[i];
		div_init(&arena_binind_div_info[i],
		    (1U << sc->lg_base) + (sc->ndelta << sc->lg_delta));
	}

	JEMALLOC_SUPPRESS_WARN_ON_USAGE(
	uint32_t cur_offset = (uint32_t)offsetof(arena_t, all_bins);
	)
	for (szind_t i = 0; i < SC_NBINS; i++) {
		arena_bin_offsets[i] = cur_offset;
		uint32_t bin_sz = (i < bin_info_nbatched_sizes
		    ? sizeof(bin_with_batch_t) : sizeof(bin_t));
		cur_offset += (uint32_t)bin_infos[i].n_shards * bin_sz;
	}
	return pa_central_init(&arena_pa_central_global, base, hpa,
	    &hpa_hooks_default);
}